

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

size_t httplib::detail::get_multipart_ranges_data_length
                 (Request *req,Response *res,string *boundary,string *content_type)

{
  size_t local_30;
  size_t data_length;
  string *content_type_local;
  string *boundary_local;
  Response *res_local;
  Request *req_local;
  
  local_30 = 0;
  data_length = (size_t)content_type;
  content_type_local = boundary;
  boundary_local = &res->version;
  res_local = (Response *)req;
  process_multipart_ranges_data<httplib::detail::get_multipart_ranges_data_length(httplib::Request_const&,httplib::Response&,std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(std::__cxx11::string_const&)_1_,httplib::detail::get_multipart_ranges_data_length(httplib::Request_const&,httplib::Response&,std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(char_const*)_1_,httplib::detail::get_multipart_ranges_data_length(httplib::Request_const&,httplib::Response&,std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(unsigned_long,unsigned_long)_1_>
            (req,res,boundary,content_type,(anon_class_8_1_b58d1f7b)&local_30,
             (anon_class_8_1_b58d1f7b)&local_30,(anon_class_8_1_b58d1f7b)&local_30);
  return local_30;
}

Assistant:

inline size_t
get_multipart_ranges_data_length(const Request &req, Response &res,
                                 const std::string &boundary,
                                 const std::string &content_type) {
  size_t data_length = 0;

  process_multipart_ranges_data(
      req, res, boundary, content_type,
      [&](const std::string &token) { data_length += token.size(); },
      [&](const char *token) { data_length += strlen(token); },
      [&](size_t /*offset*/, size_t length) {
        data_length += length;
        return true;
      });

  return data_length;
}